

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ym2612_Emu.cpp
# Opt level: O1

int __thiscall Ym2612_Impl::CHANNEL_SET(Ym2612_Impl *this,int Adr,int data)

{
  byte bVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  
  uVar5 = Adr & 3;
  if (uVar5 == 3) {
    return 1;
  }
  uVar6 = (Adr & 0xfcU) - 0xa0 >> 2;
  if (5 < uVar6) {
    return 0;
  }
  uVar2 = ((Adr << 0x17) >> 0x1f & 3U) + uVar5;
  switch(uVar6) {
  case 0:
    iVar4 = ((this->YM2612).CHANNEL[uVar2].FNUM[0] & 0x700U) + data;
    (this->YM2612).CHANNEL[uVar2].FNUM[0] = iVar4;
    uVar5 = (uint)""[iVar4 >> 7] | (this->YM2612).CHANNEL[uVar2].FOCT[0] << 2;
    goto LAB_00586aed;
  case 1:
    uVar6 = (data & 7U) << 8 | (uint)(byte)(this->YM2612).CHANNEL[uVar2].FNUM[0];
    (this->YM2612).CHANNEL[uVar2].FNUM[0] = uVar6;
    uVar5 = (uint)data >> 3 & 7;
    (this->YM2612).CHANNEL[uVar2].FOCT[0] = uVar5;
    uVar5 = (uint)""[uVar6 >> 7] | uVar5 << 2;
LAB_00586aed:
    (this->YM2612).CHANNEL[uVar2].KC[0] = uVar5;
    (this->YM2612).CHANNEL[uVar2].SLOT[0].Finc = -1;
    return 0;
  case 2:
    if (Adr < 0x100) {
      iVar4 = ((this->YM2612).CHANNEL[2].FNUM[(ulong)uVar5 + 1] & 0x700U) + data;
      (this->YM2612).CHANNEL[2].FNUM[(ulong)uVar5 + 1] = iVar4;
      uVar6 = (uint)""[iVar4 >> 7] | (this->YM2612).CHANNEL[2].FOCT[(ulong)uVar5 + 1] << 2;
LAB_00586aae:
      (this->YM2612).CHANNEL[2].KC[(ulong)uVar5 + 1] = uVar6;
      (this->YM2612).CHANNEL[2].SLOT[0].Finc = -1;
      return 0;
    }
    break;
  case 3:
    if (Adr < 0x100) {
      uVar2 = (data & 7U) << 8 | (uint)(byte)(this->YM2612).CHANNEL[2].FNUM[(ulong)uVar5 + 1];
      (this->YM2612).CHANNEL[2].FNUM[(ulong)uVar5 + 1] = uVar2;
      uVar6 = (uint)data >> 3 & 7;
      (this->YM2612).CHANNEL[2].FOCT[(ulong)uVar5 + 1] = uVar6;
      uVar6 = (uint)""[uVar2 >> 7] | uVar6 << 2;
      goto LAB_00586aae;
    }
    break;
  case 4:
    if ((this->YM2612).CHANNEL[uVar2].ALGO != (data & 7U)) {
      (this->YM2612).CHANNEL[uVar2].ALGO = data & 7U;
      (this->YM2612).CHANNEL[uVar2].SLOT[0].ChgEnM = 0;
      (this->YM2612).CHANNEL[uVar2].SLOT[1].ChgEnM = 0;
      (this->YM2612).CHANNEL[uVar2].SLOT[2].ChgEnM = 0;
      (this->YM2612).CHANNEL[uVar2].SLOT[3].ChgEnM = 0;
    }
    (this->YM2612).CHANNEL[uVar2].FB = 9 - ((uint)data >> 3 & 7);
    return 0;
  case 5:
    (this->YM2612).CHANNEL[uVar2].LEFT = (int)(char)data >> 7;
    (this->YM2612).CHANNEL[uVar2].RIGHT = (data << 0x19) >> 0x1f;
    bVar1 = "\x1f\x04\x01"[(uint)data >> 4 & 3];
    (this->YM2612).CHANNEL[uVar2].AMS = (uint)bVar1;
    (this->YM2612).CHANNEL[uVar2].FMS = (uint)""[data & 7];
    lVar3 = 0x10c;
    do {
      uVar5 = (uint)bVar1;
      if (*(int *)((long)(this->YM2612).CHANNEL[uVar2].S0_OUT + lVar3 + -0x28) == 0) {
        uVar5 = 0x1f;
      }
      *(uint *)((long)(this->YM2612).CHANNEL[uVar2].S0_OUT + lVar3 + -0x2c) = uVar5;
      lVar3 = lVar3 + 0x90;
    } while (lVar3 != 0x34c);
  }
  return 0;
}

Assistant:

int Ym2612_Impl::CHANNEL_SET( int Adr, int data )
{
	int num = Adr & 3;
	if ( num == 3 )
		return 1;
	
	channel_t& ch = YM2612.CHANNEL [num + (Adr & 0x100 ? 3 : 0)];
	
	switch ( Adr & 0xFC )
	{
		case 0xA0:
			YM2612_Special_Update();

			ch.FNUM [0] = (ch.FNUM [0] & 0x700) + data;
			ch.KC [0] = (ch.FOCT [0] << 2) | FKEY_TAB [ch.FNUM [0] >> 7];

			ch.SLOT [0].Finc = -1;
			break;

		case 0xA4:
			YM2612_Special_Update();

			ch.FNUM [0] = (ch.FNUM [0] & 0x0FF) + ((data & 0x07) << 8);
			ch.FOCT [0] = (data & 0x38) >> 3;
			ch.KC [0] = (ch.FOCT [0] << 2) | FKEY_TAB [ch.FNUM [0] >> 7];

			ch.SLOT [0].Finc = -1;
			break;

		case 0xA8:
			if ( Adr < 0x100 )
			{
				num++;

				YM2612_Special_Update();

				YM2612.CHANNEL [2].FNUM [num] = (YM2612.CHANNEL [2].FNUM [num] & 0x700) + data;
				YM2612.CHANNEL [2].KC [num] = (YM2612.CHANNEL [2].FOCT [num] << 2) |
						FKEY_TAB [YM2612.CHANNEL [2].FNUM [num] >> 7];

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;
			}
			break;

		case 0xAC:
			if ( Adr < 0x100 )
			{
				num++;

				YM2612_Special_Update();

				YM2612.CHANNEL [2].FNUM [num] = (YM2612.CHANNEL [2].FNUM [num] & 0x0FF) + ((data & 0x07) << 8);
				YM2612.CHANNEL [2].FOCT [num] = (data & 0x38) >> 3;
				YM2612.CHANNEL [2].KC [num] = (YM2612.CHANNEL [2].FOCT [num] << 2) |
						FKEY_TAB [YM2612.CHANNEL [2].FNUM [num] >> 7];

				YM2612.CHANNEL [2].SLOT [0].Finc = -1;
			}
			break;

		case 0xB0:
			if ( ch.ALGO != (data & 7) )
			{
				// Fix VectorMan 2 heli sound (level 1)
				YM2612_Special_Update();

				ch.ALGO = data & 7;
				
				ch.SLOT [0].ChgEnM = 0;
				ch.SLOT [1].ChgEnM = 0;
				ch.SLOT [2].ChgEnM = 0;
				ch.SLOT [3].ChgEnM = 0;
			}

			ch.FB = 9 - ((data >> 3) & 7);                              // Real thing ?

//          if (ch.FB = ((data >> 3) & 7)) ch.FB = 9 - ch.FB;       // Thunder force 4 (music stage 8), Gynoug, Aladdin bug sound...
//          else ch.FB = 31;
			break;

		case 0xB4: {
			YM2612_Special_Update();
			
			ch.LEFT = 0 - ((data >> 7) & 1);
			ch.RIGHT = 0 - ((data >> 6) & 1);
			
			ch.AMS = LFO_AMS_TAB [(data >> 4) & 3];
			ch.FMS = LFO_FMS_TAB [data & 7];
			
			for ( int i = 0; i < 4; i++ )
			{
				slot_t& sl = ch.SLOT [i];
				sl.AMS = (sl.AMSon ? ch.AMS : 31);
			}
			break;
		}
	}
	
	return 0;
}